

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_storage.cpp
# Opt level: O3

BlockPointer duckdb::BlockPointer::Deserialize(Deserializer *deserializer)

{
  uint uVar1;
  uint uVar2;
  undefined4 extraout_var;
  _func_int **pp_Var3;
  ulong uVar4;
  BlockPointer BVar5;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"block_id");
  BVar5.block_id._0_4_ = (*deserializer->_vptr_Deserializer[0x14])(deserializer);
  BVar5.block_id._4_4_ = extraout_var;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"offset");
  pp_Var3 = deserializer->_vptr_Deserializer;
  if ((char)uVar1 == '\0') {
    uVar4 = 0;
  }
  else {
    uVar2 = (*pp_Var3[0x13])(deserializer);
    pp_Var3 = deserializer->_vptr_Deserializer;
    uVar4 = (ulong)uVar2;
  }
  (*pp_Var3[5])(deserializer,(ulong)(uVar1 & 0xff));
  BVar5.offset = (int)uVar4;
  BVar5.unused_padding = (int)(uVar4 >> 0x20);
  return BVar5;
}

Assistant:

BlockPointer BlockPointer::Deserialize(Deserializer &deserializer) {
	auto block_id = deserializer.ReadProperty<block_id_t>(100, "block_id");
	auto offset = deserializer.ReadPropertyWithDefault<uint32_t>(101, "offset");
	BlockPointer result(block_id, offset);
	return result;
}